

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

Error * ot::commissioner::JsonFromFile(Error *__return_storage_ptr__,string *aJson,string *aPath)

{
  ErrorCode EVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  Json json;
  string jsonStr;
  undefined1 local_e0 [40];
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  undefined1 local_a8 [8];
  char local_a0 [16];
  input_adapter local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  local_80 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_80;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ReadFile((Error *)local_b8,&local_50,aPath);
  __return_storage_ptr__->mCode = local_b8._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_b0);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if (EVar1 == kNone) {
    StripComments((string *)local_b8,&local_50);
    first._M_current._4_4_ = local_b8._4_4_;
    first._M_current._0_4_ = local_b8._0_4_;
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (&local_90,first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_b0._M_p + first._M_current));
    local_68 = (code *)0x0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_e0,&local_90,(parser_callback_t *)&local_78,true);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_90.ia.
        super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.ia.
                 super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != local_a8) {
      operator_delete((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)local_b8,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_e0,4,' ',false,strict);
    std::__cxx11::string::operator=((string *)aJson,(string *)local_b8);
    if ((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_) != local_a8) {
      operator_delete((undefined1 *)CONCAT44(local_b8._4_4_,local_b8._0_4_));
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_e0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_e0 + 8),local_e0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JsonFromFile(std::string &aJson, const std::string &aPath)
{
    Error       error;
    std::string jsonStr;

    SuccessOrExit(error = ReadFile(jsonStr, aPath));
    try
    {
        Json json = Json::parse(StripComments(jsonStr));
        aJson     = json.dump(JSON_INDENT_DEFAULT);
    } catch (JsonException &e)
    {
        error = {ErrorCode::kBadFormat, e.GetError().GetMessage()};
    } catch (std::exception &e)
    {
        error = {ErrorCode::kBadFormat, e.what()};
    }
exit:
    return error;
}